

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

void memory_tree_ns::diag_kronecker_prod_fs_test
               (features *f1,features *f2,features *prod_f,float *total_sum_feat_sq,float norm_sq1,
               float norm_sq2)

{
  ulong uVar1;
  size_t sVar2;
  unsigned_long *puVar3;
  float *pfVar4;
  float *in_RCX;
  undefined8 in_RDX;
  v_array<float> *in_RSI;
  v_array<float> *in_RDI;
  bool bVar5;
  float in_XMM0_Da;
  double dVar6;
  float in_XMM1_Da;
  uint64_t ec2pos;
  uint64_t ec1pos;
  size_t idx2;
  size_t idx1;
  float denominator;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  float fVar7;
  feature_value v;
  undefined4 in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  ulong local_40;
  ulong local_38;
  
  features::delete_v((features *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  sVar2 = v_array<unsigned_long>::size((v_array<unsigned_long> *)(in_RSI + 1));
  if (sVar2 != 0) {
    dVar6 = std::pow((double)(ulong)(uint)(in_XMM0_Da * in_XMM1_Da),5.2220990168286e-315);
    local_38 = 0;
    local_40 = 0;
    while( true ) {
      sVar2 = features::size((features *)0x2e5d85);
      bVar5 = false;
      if (local_38 < sVar2) {
        sVar2 = features::size((features *)0x2e5dac);
        bVar5 = local_40 < sVar2;
      }
      if (!bVar5) break;
      puVar3 = v_array<unsigned_long>::operator[]((v_array<unsigned_long> *)(in_RDI + 1),local_38);
      uVar1 = *puVar3;
      puVar3 = v_array<unsigned_long>::operator[]((v_array<unsigned_long> *)(in_RSI + 1),local_40);
      if (uVar1 < *puVar3) {
        local_38 = local_38 + 1;
      }
      else {
        if (uVar1 <= *puVar3) {
          v = (feature_value)((ulong)in_RDX >> 0x20);
          pfVar4 = v_array<float>::operator[](in_RDI,local_38);
          fVar7 = *pfVar4;
          v_array<float>::operator[](in_RSI,local_40);
          features::push_back((features *)
                              CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),v,
                              CONCAT44(fVar7,in_stack_ffffffffffffff80));
          pfVar4 = v_array<float>::operator[](in_RDI,local_38);
          in_stack_ffffffffffffff94 = *pfVar4;
          pfVar4 = v_array<float>::operator[](in_RSI,local_40);
          *in_RCX = (in_stack_ffffffffffffff94 * *pfVar4) / SUB84(dVar6,0) + *in_RCX;
          local_38 = local_38 + 1;
        }
        local_40 = local_40 + 1;
      }
    }
  }
  return;
}

Assistant:

void diag_kronecker_prod_fs_test(features& f1, features& f2, features& prod_f, float& total_sum_feat_sq, float norm_sq1, float norm_sq2)
    {
        prod_f.delete_v();
        if (f2.indicies.size() == 0)
            return;
    
        float denominator = pow(norm_sq1*norm_sq2,0.5f);
        size_t idx1 = 0;
        size_t idx2 = 0;

        while (idx1 < f1.size() && idx2 < f2.size())
        {
            uint64_t ec1pos = f1.indicies[idx1];
            uint64_t ec2pos = f2.indicies[idx2];
            
            if (ec1pos < ec2pos)
                idx1++;
            else if(ec1pos > ec2pos)
                idx2++;
            else{
                prod_f.push_back(f1.values[idx1]*f2.values[idx2]/denominator, ec1pos);
                total_sum_feat_sq+=f1.values[idx1]*f2.values[idx2]/denominator;  //make this out of loop
                idx1++;
                idx2++;
            }
        }
    }